

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O2

ssize_t __thiscall input::read(input *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  void *__n;
  
  sVar1 = this->pos;
  uVar2 = this->buf->_M_string_length;
  __n = (void *)(uVar2 - sVar1);
  if (sVar1 + (long)__buf <= uVar2) {
    __n = __buf;
  }
  memcpy((void *)CONCAT44(in_register_00000034,__fd),(this->buf->_M_dataplus)._M_p + sVar1,
         (size_t)__n);
  this->pos = this->pos + (long)__n;
  return (ssize_t)__n;
}

Assistant:

size_t read(char *p,size_t n)
	{
		if( n + pos > buf->size())
			n=buf->size() - pos;
		memcpy(p,buf->c_str()+pos,n);
		pos+=n;
		return n;
	}